

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

void __thiscall
BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BTs
          (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          cmListFileBacktrace *bt)

{
  cmListFileBacktrace *bt_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)v);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::vector(&this->Backtraces);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
  emplace_back<cmListFileBacktrace>(&this->Backtraces,bt);
  return;
}

Assistant:

BTs(T v = T(), cmListFileBacktrace bt = cmListFileBacktrace())
    : Value(std::move(v))
  {
    this->Backtraces.emplace_back(std::move(bt));
  }